

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausibly
          (CompilerMain *this,Format format,ArrayPtr<const_unsigned_char> prefix)

{
  Format format_local;
  CompilerMain *this_local;
  ArrayPtr<const_unsigned_char> prefix_local;
  
  switch(format) {
  case BINARY:
    prefix_local.size_._4_4_ = isPlausiblyBinary(this,prefix);
    break;
  case PACKED:
    prefix_local.size_._4_4_ = isPlausiblyPacked(this,prefix);
    break;
  case FLAT:
    prefix_local.size_._4_4_ = isPlausiblyFlat(this,prefix,1);
    break;
  case FLAT_PACKED:
    prefix_local.size_._4_4_ = isPlausiblyPackedFlat(this,prefix);
    break;
  case CANONICAL:
    prefix_local.size_._4_4_ = isPlausiblyFlat(this,prefix,1);
    break;
  case TEXT:
    prefix_local.size_._4_4_ = isPlausiblyText(this,prefix);
    break;
  case JSON:
    prefix_local.size_._4_4_ = isPlausiblyJson(this,prefix);
    break;
  default:
    kj::_::unreachable();
  }
  return prefix_local.size_._4_4_;
}

Assistant:

Plausibility isPlausibly(Format format, kj::ArrayPtr<const byte> prefix) {
    switch (format) {
      case Format::BINARY     : return isPlausiblyBinary    (prefix);
      case Format::PACKED     : return isPlausiblyPacked    (prefix);
      case Format::FLAT       : return isPlausiblyFlat      (prefix);
      case Format::FLAT_PACKED: return isPlausiblyPackedFlat(prefix);
      case Format::CANONICAL  : return isPlausiblyFlat      (prefix);
      case Format::TEXT       : return isPlausiblyText      (prefix);
      case Format::JSON       : return isPlausiblyJson      (prefix);
    }
    KJ_UNREACHABLE;
  }